

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::has_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  ulong uVar1;
  size_t sVar2;
  Decoration *pDVar3;
  Decoration *dec;
  Meta *local_30;
  Meta *m;
  uint32_t local_20;
  ExtendedDecorations decoration_local;
  uint32_t index_local;
  uint32_t type_local;
  Compiler *this_local;
  
  m._4_4_ = decoration;
  local_20 = index;
  decoration_local = type;
  _index_local = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&dec + 4),type);
  local_30 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  if (local_30 == (Meta *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (ulong)local_20;
    sVar2 = VectorView<diligent_spirv_cross::Meta::Decoration>::size
                      (&(local_30->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>
                      );
    if (uVar1 < sVar2) {
      pDVar3 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                         (&(local_30->members).
                           super_VectorView<diligent_spirv_cross::Meta::Decoration>,(ulong)local_20)
      ;
      this_local._7_1_ = Bitset::get(&(pDVar3->extended).flags,m._4_4_);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::has_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return false;

	if (index >= m->members.size())
		return false;

	auto &dec = m->members[index];
	return dec.extended.flags.get(decoration);
}